

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

bool re2::IsValidUTF8(StringPiece *s,RegexpStatus *status)

{
  size_type sVar1;
  int iVar2;
  Rune r;
  StringPiece t;
  Rune local_3c;
  StringPiece local_38;
  
  local_38.data_ = s->data_;
  local_38.size_ = s->size_;
  do {
    sVar1 = local_38.size_;
    if (local_38.size_ == 0) break;
    iVar2 = StringPieceToRune(&local_3c,&local_38,status);
  } while (-1 < iVar2);
  return sVar1 == 0;
}

Assistant:

static bool IsValidUTF8(const StringPiece& s, RegexpStatus* status) {
  StringPiece t = s;
  Rune r;
  while (!t.empty()) {
    if (StringPieceToRune(&r, &t, status) < 0)
      return false;
  }
  return true;
}